

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

void __thiscall pg::Game::write_pgsolver(Game *this,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  int *piVar4;
  ulong uVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"parity ",7);
  poVar2 = std::ostream::_M_insert<long>((long)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,";",1);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (0 < this->n_vertices) {
    uVar5 = 0;
    do {
      poVar2 = (ostream *)std::ostream::operator<<(os,(int)uVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_priority[uVar5]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,(uint)(((this->_owner)._bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) !=
                                       0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      if (this->_outedges[this->_firstouts[uVar5]] != -1) {
        piVar4 = this->_outedges + (long)this->_firstouts[uVar5] + 1;
        bVar3 = true;
        do {
          if (bVar3) {
            bVar3 = false;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
          }
          std::ostream::operator<<(os,piVar4[-1]);
          iVar1 = *piVar4;
          piVar4 = piVar4 + 1;
        } while (iVar1 != -1);
      }
      if ((this->_label[uVar5] != (string *)0x0) && (this->_label[uVar5]->_M_string_length != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," \"",2);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(this->_label[uVar5]->_M_dataplus)._M_p,
                            this->_label[uVar5]->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,";",1);
      std::ios::widen((char)os->_vptr_basic_ostream[-3] + (char)os);
      std::ostream::put((char)os);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < this->n_vertices);
  }
  return;
}

Assistant:

void
Game::write_pgsolver(std::ostream &os)
{
    // print banner
    os << "parity " << n_vertices << ";" << std::endl;

    // print vertices
    for (int i=0; i<n_vertices; i++) {
        os << i << " " << priority(i) << " " << owner(i) << " ";
        bool first = true;
        for (auto curedge = outs(i); *curedge != -1; curedge++) {
            if (first) first = false;
            else os << ",";
            os << *curedge;
        }
        if (_label[i] != 0 and !_label[i]->empty()) os << " \"" << *_label[i] << "\"";
        os << ";" << std::endl;
    }
}